

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArbitraryInteger.cpp
# Opt level: O0

TDigitIndex __thiscall Refal2::CArbitraryInteger::GetSize(CArbitraryInteger *this)

{
  bool bVar1;
  reference puVar2;
  bool bVar3;
  undefined1 local_28 [16];
  const_reverse_iterator i;
  size_type result;
  CArbitraryInteger *this_local;
  
  i.current._M_current =
       (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
        )std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                   (&this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::crbegin
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_28 + 8));
  while( true ) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::crend
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_28);
    bVar1 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             *)(local_28 + 8),
                            (reverse_iterator<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             *)local_28);
    bVar3 = false;
    if (bVar1) {
      puVar2 = std::
               reverse_iterator<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                            *)(local_28 + 8));
      bVar3 = *puVar2 == 0;
    }
    if (!bVar3) break;
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  *)(local_28 + 8));
    i.current._M_current =
         (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
          )((long)i.current._M_current + -1);
  }
  return (TDigitIndex)i.current._M_current._M_current;
}

Assistant:

CArbitraryInteger::TDigitIndex CArbitraryInteger::GetSize() const
{
	size_type result = size();
	const_reverse_iterator i = crbegin();
	while( i != crend() && *i == 0 ) {
		++i;
		result--;
	}
	return result;
}